

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QDirSortItem>::emplace_back_impl<QFileInfo_const&,QFlags<QDir::SortFlag>&>
          (QVLABase<QDirSortItem> *this,qsizetype prealloc,void *array,QFileInfo *args,
          QFlags<QDir::SortFlag> *args_1)

{
  qsizetype *pqVar1;
  long asize;
  long aalloc;
  QDirSortItem *this_00;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  this_00 = (QDirSortItem *)(asize * 0x38 + (long)(this->super_QVLABaseBase).ptr);
  QDirSortItem::QDirSortItem
            (this_00,args,
             (SortFlags)
             (args_1->super_QFlagsStorageHelper<QDir::SortFlag,_4>).
             super_QFlagsStorage<QDir::SortFlag>.i);
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return this_00;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }